

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void array__reserve(VoidArray *self,size_t element_size,uint32_t new_capacity)

{
  void *pvVar1;
  
  if (self->capacity < new_capacity) {
    if (self->contents == (void *)0x0) {
      pvVar1 = ts_calloc((ulong)new_capacity,element_size);
    }
    else {
      pvVar1 = ts_realloc(self->contents,new_capacity * element_size);
    }
    self->contents = pvVar1;
    self->capacity = new_capacity;
  }
  return;
}

Assistant:

static inline void array__reserve(VoidArray *self, size_t element_size, uint32_t new_capacity) {
  if (new_capacity > self->capacity) {
    if (self->contents) {
      self->contents = ts_realloc(self->contents, new_capacity * element_size);
    } else {
      self->contents = ts_calloc(new_capacity, element_size);
    }
    self->capacity = new_capacity;
  }
}